

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

Ptr __thiscall hwnet::Buffer::New(Buffer *this,char *str,size_t len)

{
  bool bVar1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Ptr PVar3;
  undefined1 local_30 [8];
  Ptr buff;
  size_t len_local;
  char *str_local;
  
  buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)len;
  if (str == (char *)0x0) {
    std::shared_ptr<hwnet::Buffer>::shared_ptr((shared_ptr<hwnet::Buffer> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    New((size_t)local_30,len);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30);
      Append(this_00,str,
             (size_t)buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
      std::shared_ptr<hwnet::Buffer>::shared_ptr
                ((shared_ptr<hwnet::Buffer> *)this,(shared_ptr<hwnet::Buffer> *)local_30);
    }
    else {
      std::shared_ptr<hwnet::Buffer>::shared_ptr((shared_ptr<hwnet::Buffer> *)this,(nullptr_t)0x0);
    }
    std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)local_30);
    _Var2._M_pi = extraout_RDX_00;
  }
  PVar3.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar3.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Buffer::Ptr New(const char *str, size_t len) {
		if(!str) {
			return nullptr;
		}
		auto buff = New(len);
		if(buff){
			buff->Append(const_cast<char*>(str),len);
			return buff;
		} else {
			return nullptr;
		}
	}